

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void I422ToYUY2Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_frame,int width)

{
  long lVar1;
  
  if (1 < width) {
    lVar1 = 0;
    do {
      *dst_frame = src_y[lVar1];
      dst_frame[1] = *src_u;
      dst_frame[2] = src_y[lVar1 + 1];
      dst_frame[3] = *src_v;
      dst_frame = dst_frame + 4;
      src_u = src_u + 1;
      src_v = src_v + 1;
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < width + -1);
    src_y = src_y + lVar1;
  }
  if ((width & 1U) != 0) {
    *dst_frame = *src_y;
    dst_frame[1] = *src_u;
    dst_frame[2] = '\0';
    dst_frame[3] = *src_v;
  }
  return;
}

Assistant:

void I422ToYUY2Row_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* dst_frame,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_frame[0] = src_y[0];
    dst_frame[1] = src_u[0];
    dst_frame[2] = src_y[1];
    dst_frame[3] = src_v[0];
    dst_frame += 4;
    src_y += 2;
    src_u += 1;
    src_v += 1;
  }
  if (width & 1) {
    dst_frame[0] = src_y[0];
    dst_frame[1] = src_u[0];
    dst_frame[2] = 0;
    dst_frame[3] = src_v[0];
  }
}